

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatErrorsTest::iterate
          (AttributeFormatErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ContextType ctxType;
  deUint32 dVar8;
  undefined4 extraout_var;
  char *description;
  byte bVar10;
  qpTestResult testResult;
  TestContext *this_00;
  int iVar11;
  GLuint vao;
  GLint max_vertex_attribs;
  byte local_4b;
  byte local_4a;
  byte local_49;
  byte local_48;
  byte local_47;
  byte local_46;
  byte local_45;
  byte local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  byte local_40;
  byte local_3f;
  byte local_3e;
  byte local_3d;
  byte local_3c;
  byte local_3b;
  byte local_3a;
  byte local_39;
  byte local_38;
  byte local_37;
  byte local_36;
  byte local_35;
  GLint max_vertex_attrib_relative_offset;
  long lVar9;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar7);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    vao = 0;
    max_vertex_attribs = 0x10;
    max_vertex_attrib_relative_offset = 0x7ff;
    bVar1 = true;
    iVar7 = 0;
LAB_00b1fc10:
    if (bVar1) {
      iVar7 = iVar7 + 1;
      bVar2 = true;
      do {
        bVar1 = bVar2;
        if (!bVar1) break;
        bVar2 = false;
      } while (iVar7 != 0x1400);
      goto LAB_00b1fc10;
    }
    (**(code **)(lVar9 + 0x410))(1,&vao);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glCreateVertexArrays call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x12b4);
    iVar11 = 0;
    do {
      iVar11 = iVar11 + 1;
      cVar3 = (**(code **)(lVar9 + 0xcd8))(iVar11);
    } while (cVar3 != '\0');
    (**(code **)(lVar9 + 0x868))(0x8869,&max_vertex_attribs);
    (**(code **)(lVar9 + 0x868))(0x82d9,&max_vertex_attrib_relative_offset);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glGetIntegerv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x12bd);
    (**(code **)(lVar9 + 0x16a8))(vao,max_vertex_attribs,1,0x1400,0,0);
    bVar1 = CheckError(this,0x501,
                       "INVALID_VALUE was not generated by VertexArrayAttribFormat if attribindex is equal to the value of MAX_VERTEX_ATTRIBS."
                      );
    (**(code **)(lVar9 + 0x16a8))(vao,max_vertex_attribs + 1,1,0x1400,0,0);
    local_35 = CheckError(this,0x501,
                          "INVALID_VALUE was not generated by VertexArrayAttribFormat if attribindex is greater than the value of MAX_VERTEX_ATTRIBS."
                         );
    (**(code **)(lVar9 + 0x16b0))(vao,max_vertex_attribs,1,0x1400,0);
    local_36 = CheckError(this,0x501,
                          "INVALID_VALUE was not generated by VertexArrayAttribIFormat if attribindex is equal to the value of MAX_VERTEX_ATTRIBS."
                         );
    (**(code **)(lVar9 + 0x16b0))(vao,max_vertex_attribs + 1,1,0x1400,0);
    local_37 = CheckError(this,0x501,
                          "INVALID_VALUE was not generated by VertexArrayAttribIFormat if attribindex is greater than the value of MAX_VERTEX_ATTRIBS."
                         );
    (**(code **)(lVar9 + 0x16b8))(vao,max_vertex_attribs,1,0x140a,0);
    local_38 = CheckError(this,0x501,
                          "INVALID_VALUE was not generated by VertexArrayAttribLFormat if attribindex is equal to the value of MAX_VERTEX_ATTRIBS."
                         );
    (**(code **)(lVar9 + 0x16b8))(vao,max_vertex_attribs + 1,1,0x140a,0);
    local_39 = CheckError(this,0x501,
                          "INVALID_VALUE was not generated by VertexArrayAttribLFormat if attribindex is greater than the value of MAX_VERTEX_ATTRIBS."
                         );
    (**(code **)(lVar9 + 0x16a8))(vao,0,0,0x1400,0,0);
    local_3a = CheckError(this,0x501,
                          "INVALID_VALUE was not generated by VertexArrayAttrib*Format if size is not one of the accepted values (0)."
                         );
    (**(code **)(lVar9 + 0x16a8))(vao,0,5,0x1400,0,0);
    local_3b = CheckError(this,0x501,
                          "INVALID_VALUE was not generated by VertexArrayAttrib*Format if size is not one of the accepted values (5)."
                         );
    (**(code **)(lVar9 + 0x16b0))(vao,0,0,0x1400,0);
    local_3c = CheckError(this,0x501,
                          "INVALID_VALUE was not generated by VertexArrayAttribIFormat if size is not one of the accepted values (0)."
                         );
    (**(code **)(lVar9 + 0x16b0))(vao,0,5,0x1400,0);
    local_3d = CheckError(this,0x501,
                          "INVALID_VALUE was not generated by VertexArrayAttribIFormat if size is not one of the accepted values (5)."
                         );
    (**(code **)(lVar9 + 0x16b8))(vao,0,0,0x140a);
    local_3e = CheckError(this,0x501,
                          "INVALID_VALUE was not generated by VertexArrayAttribLFormat if size is not one of the accepted values (0)."
                         );
    (**(code **)(lVar9 + 0x16b8))(vao,0,5,0x140a,0);
    local_3f = CheckError(this,0x501,
                          "INVALID_VALUE was not generated by VertexArrayAttribLFormat if size is not one of the accepted values (5)."
                         );
    (**(code **)(lVar9 + 0x16a8))(vao,0,1,0x1400,0);
    local_40 = CheckError(this,0x501,
                          "INVALID_VALUE was not generated by VertexArrayAttrib*Format if relativeoffset is greater than the value of MAX_VERTEX_ATTRIB_RELATIVE_OFFSET."
                         );
    (**(code **)(lVar9 + 0x16b0))(vao,0,1,0x1400,max_vertex_attrib_relative_offset + 1);
    local_41 = CheckError(this,0x501,
                          "INVALID_VALUE was not generated by VertexArrayAttribIFormat if relativeoffset is greater than the value of MAX_VERTEX_ATTRIB_RELATIVE_OFFSET."
                         );
    (**(code **)(lVar9 + 0x16b8))(vao,0,1,0x140a);
    local_42 = CheckError(this,0x501,
                          "INVALID_VALUE was not generated by VertexArrayAttribLFormat if relativeoffset is greater than the value of MAX_VERTEX_ATTRIB_RELATIVE_OFFSET."
                         );
    (**(code **)(lVar9 + 0x16a8))(vao,0,1,iVar7);
    local_43 = CheckError(this,0x500,
                          "INVALID_ENUM was not generated by VertexArrayAttribFormat if type is not one of the accepted tokens."
                         );
    (**(code **)(lVar9 + 0x16b0))(vao,0,1,iVar7);
    local_44 = CheckError(this,0x500,
                          "INVALID_ENUM was not generated by VertexArrayAttribIFormat if type is not one of the accepted tokens."
                         );
    (**(code **)(lVar9 + 0x16b8))(vao,0,1,iVar7);
    local_45 = CheckError(this,0x500,
                          "INVALID_ENUM was not generated by VertexArrayAttribLFormat if type is not one of the accepted tokens."
                         );
    (**(code **)(lVar9 + 0x16b0))(vao,0,1,0x8c3b);
    local_46 = CheckError(this,0x500,
                          "INVALID_ENUM was not generated by VertexArrayAttribIFormat if type is UNSIGNED_INT_10F_11F_11F_REV."
                         );
    (**(code **)(lVar9 + 0x16b8))(vao,0,1,0x8c3b,0);
    local_47 = CheckError(this,0x500,
                          "INVALID_ENUM was not generated by VertexArrayAttribLFormat if type is UNSIGNED_INT_10F_11F_11F_REV."
                         );
    (**(code **)(lVar9 + 0x16a8))(iVar11,0,1,0x1400,0,0);
    local_48 = CheckError(this,0x502,
                          "INVALID_OPERATION was not generated by VertexArrayAttribFormat if vaobj is not the name of an existing vertex array object."
                         );
    (**(code **)(lVar9 + 0x16b0))(iVar11,0,1,0x1400,0);
    local_49 = CheckError(this,0x502,
                          "INVALID_OPERATION was not generated by VertexArrayAttribIFormat if vaobj is not the name of an existing vertex array object."
                         );
    (**(code **)(lVar9 + 0x16b8))(iVar11,0,1,0x140a,0);
    local_4a = CheckError(this,0x502,
                          "INVALID_OPERATION was not generated by VertexArrayAttribLFormat if vaobj is not the name of an existing vertex array object."
                         );
    (**(code **)(lVar9 + 0x16a8))(vao,0,0x80e1,0x1400,1,0);
    local_4b = CheckError(this,0x502,
                          "INVALID_OPERATION was not generated by VertexArrayAttribFormat if size is BGRA and type is not UNSIGNED_BYTE, INT_2_10_10_10_REV or UNSIGNED_INT_2_10_10_10_REV."
                         );
    (**(code **)(lVar9 + 0x16a8))(vao,0,1,0x8d9f,1,0);
    bVar2 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayAttribFormat if type is INT_2_10_10_10_REV and size is neither 4 nor BGRA."
                      );
    (**(code **)(lVar9 + 0x16a8))(vao,0,1,0x8368,1,0);
    bVar4 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayAttribFormat if type is UNSIGNED_INT_2_10_10_10_REV and size is neither 4 nor BGRA."
                      );
    (**(code **)(lVar9 + 0x16a8))(vao,0,1,0x8c3b,1,0);
    bVar5 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayAttribFormat if type is UNSIGNED_INT_10F_11F_11F_REV and size is not 3."
                      );
    (**(code **)(lVar9 + 0x16a8))(vao,0,0x80e1,0x1401,0,0);
    bVar6 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by VertexArrayAttribFormat if size is BGRA and normalized is FALSE."
                      );
    bVar10 = bVar1 & local_35 & local_36 & local_37 & local_38 & local_39 & local_3a & local_3b &
             local_3c & local_3d & local_3e & local_3f & local_40 & local_41 & local_42 & local_43 &
             local_44 & local_45 & local_46 & local_47 & local_48 & local_49 & local_4a & local_4b;
    if (vao != 0) {
      (**(code **)(lVar9 + 0x490))(1);
    }
    do {
      iVar7 = (**(code **)(lVar9 + 0x800))();
    } while (iVar7 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((bVar10 & bVar2 & bVar4 & bVar5 & bVar6) == 0) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult AttributeFormatErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Tested Objects. */
	glw::GLuint vao		  = 0;
	glw::GLuint not_a_vao = 0;

	/* Limits. (Minimum values - OpenGL 4.5 Core Specification, Table 23.55) */
	glw::GLint max_vertex_attribs				 = 16;
	glw::GLint max_vertex_attrib_relative_offset = 2047;

	/* Invalid values. */
	glw::GLenum bad_type = 0;

	static const glw::GLenum accepted_types[] = { GL_BYTE,
												  GL_SHORT,
												  GL_INT,
												  GL_FIXED,
												  GL_FLOAT,
												  GL_HALF_FLOAT,
												  GL_DOUBLE,
												  GL_UNSIGNED_BYTE,
												  GL_UNSIGNED_SHORT,
												  GL_UNSIGNED_INT,
												  GL_INT_2_10_10_10_REV,
												  GL_UNSIGNED_INT_2_10_10_10_REV,
												  GL_UNSIGNED_INT_10F_11F_11F_REV };

	{
		bool is_accepted_type = true;
		while (is_accepted_type)
		{
			bad_type++;
			is_accepted_type = false;
			for (glw::GLuint i = 0; i < sizeof(accepted_types) / sizeof(accepted_types); ++i)
			{
				if (accepted_types[i] == bad_type)
				{
					is_accepted_type = true;
					break;
				}
			}
		}
	}

	try
	{
		/* Prepare valid Objects. */
		gl.createVertexArrays(1, &vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateVertexArrays call failed.");

		/* Prepare invalid VAO. */
		while (gl.isVertexArray(++not_a_vao))
			;

		/* Prepare limits. */
		gl.getIntegerv(GL_MAX_VERTEX_ATTRIBS, &max_vertex_attribs);
		gl.getIntegerv(GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET, &max_vertex_attrib_relative_offset);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

		/* TESTS OF VERTEXARRAYATTRIBFORMAT */

		/* MAX_VERTEX_ATTRIBS < */
		gl.vertexArrayAttribFormat(vao, max_vertex_attribs, 1, GL_BYTE, GL_FALSE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribFormat if "
											  "attribindex is equal to the value of MAX_VERTEX_ATTRIBS.");

		gl.vertexArrayAttribFormat(vao, max_vertex_attribs + 1, 1, GL_BYTE, GL_FALSE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribFormat if "
											  "attribindex is greater than the value of MAX_VERTEX_ATTRIBS.");

		gl.vertexArrayAttribIFormat(vao, max_vertex_attribs, 1, GL_BYTE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribIFormat if "
											  "attribindex is equal to the value of MAX_VERTEX_ATTRIBS.");

		gl.vertexArrayAttribIFormat(vao, max_vertex_attribs + 1, 1, GL_BYTE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribIFormat if "
											  "attribindex is greater than the value of MAX_VERTEX_ATTRIBS.");

		gl.vertexArrayAttribLFormat(vao, max_vertex_attribs, 1, GL_DOUBLE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribLFormat if "
											  "attribindex is equal to the value of MAX_VERTEX_ATTRIBS.");

		gl.vertexArrayAttribLFormat(vao, max_vertex_attribs + 1, 1, GL_DOUBLE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribLFormat if "
											  "attribindex is greater than the value of MAX_VERTEX_ATTRIBS.");

		/* size */
		gl.vertexArrayAttribFormat(vao, 0, 0, GL_BYTE, GL_FALSE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttrib*Format if size is "
											  "not one of the accepted values (0).");

		gl.vertexArrayAttribFormat(vao, 0, 5, GL_BYTE, GL_FALSE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttrib*Format if size is "
											  "not one of the accepted values (5).");

		gl.vertexArrayAttribIFormat(vao, 0, 0, GL_BYTE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribIFormat if size is "
											  "not one of the accepted values (0).");

		gl.vertexArrayAttribIFormat(vao, 0, 5, GL_BYTE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribIFormat if size is "
											  "not one of the accepted values (5).");

		gl.vertexArrayAttribLFormat(vao, 0, 0, GL_DOUBLE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribLFormat if size is "
											  "not one of the accepted values (0).");

		gl.vertexArrayAttribLFormat(vao, 0, 5, GL_DOUBLE, 0);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribLFormat if size is "
											  "not one of the accepted values (5).");

		/* relative offset */
		gl.vertexArrayAttribFormat(vao, 0, 1, GL_BYTE, GL_FALSE, max_vertex_attrib_relative_offset + 1);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttrib*Format if "
											  "relativeoffset is greater than the value of "
											  "MAX_VERTEX_ATTRIB_RELATIVE_OFFSET.");

		gl.vertexArrayAttribIFormat(vao, 0, 1, GL_BYTE, max_vertex_attrib_relative_offset + 1);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribIFormat if "
											  "relativeoffset is greater than the value of "
											  "MAX_VERTEX_ATTRIB_RELATIVE_OFFSET.");

		gl.vertexArrayAttribLFormat(vao, 0, 1, GL_DOUBLE, max_vertex_attrib_relative_offset + 1);

		is_ok &= CheckError(GL_INVALID_VALUE, "INVALID_VALUE was not generated by VertexArrayAttribLFormat if "
											  "relativeoffset is greater than the value of "
											  "MAX_VERTEX_ATTRIB_RELATIVE_OFFSET.");

		/* type */
		gl.vertexArrayAttribFormat(vao, 0, 1, bad_type, GL_FALSE, 0);

		is_ok &= CheckError(
			GL_INVALID_ENUM,
			"INVALID_ENUM was not generated by VertexArrayAttribFormat if type is not one of the accepted tokens.");

		gl.vertexArrayAttribIFormat(vao, 0, 1, bad_type, 0);

		is_ok &= CheckError(
			GL_INVALID_ENUM,
			"INVALID_ENUM was not generated by VertexArrayAttribIFormat if type is not one of the accepted tokens.");

		gl.vertexArrayAttribLFormat(vao, 0, 1, bad_type, 0);

		is_ok &= CheckError(
			GL_INVALID_ENUM,
			"INVALID_ENUM was not generated by VertexArrayAttribLFormat if type is not one of the accepted tokens.");

		/* type UNSIGNED_INT_10F_11F_11F_REV case */
		gl.vertexArrayAttribIFormat(vao, 0, 1, GL_UNSIGNED_INT_10F_11F_11F_REV, 0);

		is_ok &= CheckError(
			GL_INVALID_ENUM,
			"INVALID_ENUM was not generated by VertexArrayAttribIFormat if type is UNSIGNED_INT_10F_11F_11F_REV.");

		gl.vertexArrayAttribLFormat(vao, 0, 1, GL_UNSIGNED_INT_10F_11F_11F_REV, 0);

		is_ok &= CheckError(
			GL_INVALID_ENUM,
			"INVALID_ENUM was not generated by VertexArrayAttribLFormat if type is UNSIGNED_INT_10F_11F_11F_REV.");

		/* Test not a VAO. */
		gl.vertexArrayAttribFormat(not_a_vao, 0, 1, GL_BYTE, GL_FALSE, 0);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayAttribFormat if "
												  "vaobj is not the name of an existing vertex array object.");

		gl.vertexArrayAttribIFormat(not_a_vao, 0, 1, GL_BYTE, 0);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayAttribIFormat if "
												  "vaobj is not the name of an existing vertex array object.");

		gl.vertexArrayAttribLFormat(not_a_vao, 0, 1, GL_DOUBLE, 0);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayAttribLFormat if "
												  "vaobj is not the name of an existing vertex array object.");

		/* BGRA */
		gl.vertexArrayAttribFormat(vao, 0, GL_BGRA, GL_BYTE, GL_TRUE, 0);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayAttribFormat if "
												  "size is BGRA and type is not UNSIGNED_BYTE, INT_2_10_10_10_REV or "
												  "UNSIGNED_INT_2_10_10_10_REV.");

		gl.vertexArrayAttribFormat(vao, 0, 1, GL_INT_2_10_10_10_REV, GL_TRUE, 0);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayAttribFormat if "
												  "type is INT_2_10_10_10_REV and size is neither 4 nor BGRA.");

		gl.vertexArrayAttribFormat(vao, 0, 1, GL_UNSIGNED_INT_2_10_10_10_REV, GL_TRUE, 0);

		is_ok &=
			CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayAttribFormat if type "
											 "is UNSIGNED_INT_2_10_10_10_REV and size is neither 4 nor BGRA.");

		gl.vertexArrayAttribFormat(vao, 0, 1, GL_UNSIGNED_INT_10F_11F_11F_REV, GL_TRUE, 0);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by VertexArrayAttribFormat if "
												  "type is UNSIGNED_INT_10F_11F_11F_REV and size is not 3.");

		gl.vertexArrayAttribFormat(vao, 0, GL_BGRA, GL_UNSIGNED_BYTE, GL_FALSE, 0);

		is_ok &= CheckError(
			GL_INVALID_OPERATION,
			"INVALID_OPERATION was not generated by VertexArrayAttribFormat if size is BGRA and normalized is FALSE.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (vao)
	{
		gl.deleteVertexArrays(1, &vao);
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}